

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::ExternalCommand::provideValue
          (ExternalCommand *this,BuildSystem *system,TaskInterface ti,uintptr_t inputID,KeyType *key
          ,BuildValue *value)

{
  Kind KVar1;
  pointer ppBVar2;
  BuildNode *pBVar3;
  StringRef str;
  undefined1 *puVar4;
  OptionalStorage<llbuild::buildsystem::BuildValue,_false> local_110;
  BuildValue local_98;
  
  (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x19])
            (this,system,ti.impl,ti.ctx,inputID,value);
  KVar1 = value->kind;
  if (KVar1 - SuccessfulCommand < 4) {
    return;
  }
  if (KVar1 == SuccessfulCommandWithOutputSignature) {
    return;
  }
  if (1 < value->numOutputInfos) {
    __assert_fail("!value.hasMultipleOutputs()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                  ,0x101,
                  "virtual void llbuild::buildsystem::ExternalCommand::provideValue(BuildSystem &, core::TaskInterface, uintptr_t, const core::KeyType &, const BuildValue &)"
                 );
  }
  switch(KVar1) {
  case MissingInput:
    if (this->allowMissingInputs != true) goto switchD_00158f89_caseD_9;
  case VirtualInput:
  case ExistingInput:
  case DirectoryTreeSignature:
  case DirectoryTreeStructureSignature:
  case StaleFileRemoval:
  case MissingOutput:
  case SkippedCommand:
    local_110.hasVal = false;
    break;
  default:
    __assert_fail("value.isExistingInput() || value.isMissingInput() || value.isMissingOutput() || value.isFailedInput() || value.isVirtualInput() || value.isSkippedCommand() || value.isDirectoryTreeSignature() || value.isDirectoryTreeStructureSignature() || value.isStaleFileRemoval()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                  ,0x107,
                  "virtual void llbuild::buildsystem::ExternalCommand::provideValue(BuildSystem &, core::TaskInterface, uintptr_t, const core::KeyType &, const BuildValue &)"
                 );
  case FailedInput:
switchD_00158f89_caseD_9:
    local_98.kind = PropagatedFailureCommand;
    local_98.numOutputInfos = 0;
    local_98.signature.value._0_4_ = 0;
    local_98.signature.value._4_4_ = 0;
    local_98.valueData.asOutputInfo.device._0_4_ = 0;
    local_98.valueData.asOutputInfo.device._4_4_ = 0;
    local_98.valueData.asOutputInfo.inode._0_4_ = 0;
    local_98.valueData._12_8_ = 0;
    local_98.valueData._20_8_ = 0;
    local_98.valueData._28_8_ = 0;
    local_98.valueData._36_8_ = 0;
    local_98.valueData._44_8_ = 0;
    local_98.valueData._52_8_ = 0;
    local_98.valueData._60_8_ = 0;
    local_98.valueData._68_8_ = 0;
    local_98.valueData._76_4_ = 0;
    local_98.stringValues.contents._0_4_ = 0;
    local_98.stringValues.contents._4_4_ = 0;
    local_98.stringValues.size = 0;
    local_110.hasVal = true;
    BuildValue::BuildValue((BuildValue *)&local_110,&local_98);
    BuildValue::~BuildValue(&local_98);
  }
  if (local_110.hasVal == true) {
    llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::operator=
              (&(this->skipValue).Storage,&local_110);
    if (value->kind == MissingInput) {
      ppBVar2 = (this->super_Command).inputs.
                super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (inputID < (ulong)((long)(this->super_Command).inputs.
                                  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar2 >> 3))
      {
        pBVar3 = ppBVar2[inputID];
        str.Data = (pBVar3->super_Node).name._M_dataplus._M_p;
        str.Length = (pBVar3->super_Node).name._M_string_length;
        BuildKey::BuildKey((BuildKey *)&local_98,'N',str);
        llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::push_back
                  ((SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *)
                   &this->missingInputKeys,(BuildKey *)&local_98);
        puVar4 = (undefined1 *)CONCAT44(local_98.numOutputInfos,local_98.kind);
      }
      else {
        BuildKey::fromData((BuildKey *)&local_98,key);
        llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::push_back
                  ((SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *)
                   &this->missingInputKeys,(BuildKey *)&local_98);
        puVar4 = (undefined1 *)CONCAT44(local_98.numOutputInfos,local_98.kind);
      }
      if ((anon_union_80_2_ecfed234_for_valueData *)puVar4 != &local_98.valueData) {
        operator_delete(puVar4,CONCAT44(local_98.valueData.asOutputInfo.device._4_4_,
                                        local_98.valueData.asOutputInfo.device._0_4_) + 1);
      }
    }
  }
  else if (value->kind == MissingOutput) {
    this->canUpdateIfNewer = false;
  }
  if (local_110.hasVal == true) {
    BuildValue::~BuildValue((BuildValue *)&local_110);
  }
  return;
}

Assistant:

void ExternalCommand::provideValue(BuildSystem& system,
                                   core::TaskInterface ti,
                                   uintptr_t inputID,
                                   const core::KeyType& key,
                                   const BuildValue& value) {
  // Inform subclasses about the value
  provideValueExternalCommand(system, ti, inputID, value);
  
  if (value.isSuccessfulCommand() || value.isFailedCommand() || value.isPropagatedFailureCommand() || value.isCancelledCommand()) {
    // If the value is a successful command, it must probably be a value that was requested for a custom task, so
    // skip the input processing
    return;
  }

  // All direct inputs should be individual node values.
  assert(!value.hasMultipleOutputs());
  assert(value.isExistingInput() || value.isMissingInput() ||
         value.isMissingOutput() || value.isFailedInput() ||
         value.isVirtualInput()  || value.isSkippedCommand() ||
         value.isDirectoryTreeSignature() ||
         value.isDirectoryTreeStructureSignature() ||
         value.isStaleFileRemoval());

  // If the input should cause this command to skip, how should it skip?
  auto getSkipValueForInput = [&]() -> llvm::Optional<BuildValue> {
    // If the value is an signature, existing, or virtual input, we are always
    // good.
    if (value.isDirectoryTreeSignature() ||
        value.isDirectoryTreeStructureSignature() ||
        value.isExistingInput() ||
        value.isVirtualInput() || value.isStaleFileRemoval())
      return llvm::None;

    // We explicitly allow running the command against a missing output, under
    // the expectation that responsibility for reporting this situation falls to
    // the command.
    //
    // FIXME: Eventually, it might be nice to harden the format so that we know
    // when an output was actually required versus optional.
    if (value.isMissingOutput())
      return llvm::None;

    // If the value is a missing input, but those are allowed, it is ok.
    if (value.isMissingInput()) {
      if (allowMissingInputs)
        return llvm::None;
      else
        return BuildValue::makePropagatedFailureCommand();
    }

    // Propagate failure.
    if (value.isFailedInput())
      return BuildValue::makePropagatedFailureCommand();

    // A skipped dependency doesn't cause this command to skip.
    if (value.isSkippedCommand())
        return llvm::None;

    llvm_unreachable("unexpected input");
  };

  // Check if we need to skip the command because of this input.
  auto skipValueForInput = getSkipValueForInput();
  if (skipValueForInput.hasValue()) {
    skipValue = std::move(skipValueForInput);
    if (value.isMissingInput()) {
      if (inputs.size() > inputID) {
        missingInputKeys.push_back(BuildKey::makeNode(inputs[inputID]));
      } else {
        missingInputKeys.push_back(BuildKey::fromData(key));
      }
    }
  } else {
    // If there is a missing input file (from a successful command), we always
    // need to run the command.
    if (value.isMissingOutput())
      canUpdateIfNewer = false;
  }
}